

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QSize __thiscall
QStyleSheetStyle::defaultSize(QStyleSheetStyle *this,QWidget *w,QSize sz,QRect *rect,int pe)

{
  uint uVar1;
  int iVar2;
  Representation RVar3;
  Representation RVar4;
  QStyleSheetStyle *pQVar5;
  long lVar6;
  ulong uVar7;
  QSize QVar8;
  undefined8 uVar9;
  Representation RVar10;
  bool bVar11;
  
  RVar4 = sz.ht.m_i;
  pQVar5 = (QStyleSheetStyle *)baseStyle(this);
  RVar10 = sz.wd.m_i;
  RVar3.m_i = RVar4.m_i;
  switch(pe) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 9:
  case 0x12:
  case 0x13:
  case 0x28:
    uVar7 = 0xd;
    goto LAB_0035a953;
  case 5:
  case 0x25:
    if (RVar10.m_i == 0xffffffff) {
      uVar1 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x25,0,w);
      sz.ht.m_i = 0;
      sz.wd.m_i = uVar1;
    }
    if (RVar4.m_i == -1) {
      lVar6 = *(long *)pQVar5;
      uVar9 = 0x26;
LAB_0035aa08:
      RVar3.m_i = (**(code **)(lVar6 + 0xe0))(pQVar5,uVar9,0,w);
    }
    break;
  case 6:
  case 0x10:
    if (RVar10.m_i == 0xffffffff) {
      uVar1 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x27,0,w);
      sz.ht.m_i = 0;
      sz.wd.m_i = uVar1;
    }
    if (RVar4.m_i == -1) {
      lVar6 = *(long *)pQVar5;
      uVar9 = 0x28;
      goto LAB_0035aa08;
    }
    break;
  case 7:
    lVar6 = *(long *)pQVar5;
    uVar9 = 2;
    goto LAB_0035a943;
  case 8:
    RVar4.m_i = 0x10;
    if (RVar10.m_i != 0xffffffff) {
      RVar4.m_i = RVar10.m_i;
    }
LAB_0035aad6:
    sz.ht.m_i = 0;
    sz.wd.m_i = RVar4.m_i;
    break;
  case 0xb:
  case 0xd:
    sz = (QSize)((ulong)sz & 0xffffffff);
    if (RVar10.m_i == 0xffffffff) {
      sz.wd.m_i = 0x10;
      sz.ht.m_i = 0;
    }
    if (RVar4.m_i == -1) {
      iVar2 = (rect->y2).m_i - (rect->y1).m_i;
      RVar3.m_i = (iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1;
    }
    break;
  case 0x11:
    if (RVar10.m_i == 0xffffffff) {
      RVar4.m_i = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,2,0,w);
      goto LAB_0035aad6;
    }
    break;
  case 0x15:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    lVar6 = *(long *)this;
    uVar9 = 9;
    pQVar5 = this;
LAB_0035a943:
    uVar7 = (**(code **)(lVar6 + 0xe0))(pQVar5,uVar9,0,w);
LAB_0035a953:
    RVar3.m_i = (int)uVar7;
    sz = (QSize)((ulong)sz & 0xffffffff);
    if (RVar10.m_i == 0xffffffff) {
      sz = (QSize)(uVar7 & 0xffffffff);
    }
    bVar11 = RVar4.m_i == -1;
LAB_0035a95b:
    if (!bVar11) {
      RVar3.m_i = RVar4.m_i;
    }
    break;
  case 0x2b:
  case 0x2c:
    uVar7 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0x2e,0,w);
    RVar3.m_i = (int)uVar7;
    sz = (QSize)((ulong)sz & 0xffffffff);
    if (RVar10.m_i == 0xffffffff) {
      sz = (QSize)(uVar7 & 0xffffffff);
    }
    bVar11 = RVar4.m_i == 1;
    goto LAB_0035a95b;
  case 0x3b:
  case 0x3c:
    RVar3.m_i = (**(code **)(*(long *)this + 0xe0))(this,0x3e,0,w);
    RVar10.m_i = RVar3.m_i;
    goto LAB_0035a981;
  }
  RVar10.m_i = ((rect->y2).m_i - (rect->y1).m_i) + 1;
  if (RVar3.m_i != -1) {
    RVar10.m_i = RVar3.m_i;
  }
  RVar3.m_i = ((rect->x2).m_i - (rect->x1).m_i) + 1;
  if (sz.wd.m_i.m_i != -1) {
    RVar3.m_i = sz.wd.m_i.m_i;
  }
LAB_0035a981:
  QVar8.ht.m_i = RVar10.m_i;
  QVar8.wd.m_i = RVar3.m_i;
  return QVar8;
}

Assistant:

QSize QStyleSheetStyle::defaultSize(const QWidget *w, QSize sz, const QRect& rect, int pe) const
{
    QStyle *base = baseStyle();

    switch (pe) {
    case PseudoElement_Indicator:
    case PseudoElement_MenuCheckMark:
        if (sz.width() == -1)
            sz.setWidth(base->pixelMetric(PM_IndicatorWidth, nullptr, w));
        if (sz.height() == -1)
            sz.setHeight(base->pixelMetric(PM_IndicatorHeight, nullptr, w));
        break;

    case PseudoElement_ExclusiveIndicator:
    case PseudoElement_GroupBoxIndicator:
        if (sz.width() == -1)
            sz.setWidth(base->pixelMetric(PM_ExclusiveIndicatorWidth, nullptr, w));
        if (sz.height() == -1)
            sz.setHeight(base->pixelMetric(PM_ExclusiveIndicatorHeight, nullptr, w));
        break;

    case PseudoElement_PushButtonMenuIndicator: {
        int pm = base->pixelMetric(PM_MenuButtonIndicator, nullptr, w);
        if (sz.width() == -1)
            sz.setWidth(pm);
        if (sz.height() == -1)
            sz.setHeight(pm);
                                      }
        break;

    case PseudoElement_ComboBoxDropDown:
        if (sz.width() == -1)
            sz.setWidth(16);
        break;

    case PseudoElement_ComboBoxArrow:
    case PseudoElement_DownArrow:
    case PseudoElement_UpArrow:
    case PseudoElement_LeftArrow:
    case PseudoElement_RightArrow:
    case PseudoElement_ToolButtonMenuArrow:
    case PseudoElement_ToolButtonMenuIndicator:
    case PseudoElement_MenuRightArrow:
        if (sz.width() == -1)
            sz.setWidth(13);
        if (sz.height() == -1)
            sz.setHeight(13);
        break;

    case PseudoElement_SpinBoxUpButton:
    case PseudoElement_SpinBoxDownButton:
        if (sz.width() == -1)
            sz.setWidth(16);
        if (sz.height() == -1)
            sz.setHeight(rect.height()/2);
        break;

    case PseudoElement_ToolButtonMenu:
        if (sz.width() == -1)
            sz.setWidth(base->pixelMetric(PM_MenuButtonIndicator, nullptr, w));
        break;

    case PseudoElement_HeaderViewUpArrow:
    case PseudoElement_HeaderViewDownArrow: {
        int pm = base->pixelMetric(PM_HeaderMargin, nullptr, w);
        if (sz.width() == -1)
            sz.setWidth(pm);
        if (sz.height() == 1)
            sz.setHeight(pm);
        break;
                                            }

    case PseudoElement_ScrollBarFirst:
    case PseudoElement_ScrollBarLast:
    case PseudoElement_ScrollBarAddLine:
    case PseudoElement_ScrollBarSubLine:
    case PseudoElement_ScrollBarSlider: {
        int pm = pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, w);
        if (sz.width() == -1)
            sz.setWidth(pm);
        if (sz.height() == -1)
            sz.setHeight(pm);
        break;
                                        }

    case PseudoElement_DockWidgetCloseButton:
    case PseudoElement_DockWidgetFloatButton: {
        int iconSize = pixelMetric(PM_SmallIconSize, nullptr, w);
        return QSize(iconSize, iconSize);
                                              }

    default:
        break;
    }

    // expand to rectangle
    if (sz.height() == -1)
        sz.setHeight(rect.height());
    if (sz.width() == -1)
        sz.setWidth(rect.width());

    return sz;
}